

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O1

char * SHA384_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA384_CTX context;
  SHA512_CTX local_e8;
  
  local_e8.h[0] = 0xcbbb9d5dc1059ed8;
  local_e8.h[1] = 0x629a292a367cd507;
  local_e8.h[2] = 0x9159015a3070dd17;
  local_e8.h[3] = 0x152fecd8f70e5939;
  local_e8.h[4] = 0x67332667ffc00b31;
  local_e8.h[5] = 0x8eb44a8768581511;
  local_e8.h[6] = 0xdb0c2e0d64f98fa7;
  local_e8.h[7] = 0x47b5481dbefa4fa4;
  local_e8.Nl = 0;
  local_e8.Nh = 0;
  local_e8.u.d[0] = 0;
  local_e8.u.d[1] = 0;
  local_e8.u.d[2] = 0;
  local_e8.u.d[3] = 0;
  local_e8.u.d[4] = 0;
  local_e8.u.d[5] = 0;
  local_e8.u.d[6] = 0;
  local_e8.u.d[7] = 0;
  local_e8.u.d[8] = 0;
  local_e8.u.d[9] = 0;
  local_e8.u.d[10] = 0;
  local_e8.u.d[0xb] = 0;
  local_e8.u.d[0xc] = 0;
  local_e8.u.d[0xd] = 0;
  local_e8.u.d[0xe] = 0;
  local_e8.u.d[0xf] = 0;
  SHA512_Update(&local_e8,data,len);
  pcVar1 = SHA384_End((SHA384_CTX *)&local_e8,digest);
  return pcVar1;
}

Assistant:

char* SHA384_Data(const sha2_byte* data, size_t len, char digest[SHA384_DIGEST_STRING_LENGTH]) {
	SHA384_CTX	context;

	SHA384_Init(&context);
	SHA384_Update(&context, data, len);
	return SHA384_End(&context, digest);
}